

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Preferences.cpp
# Opt level: O0

void __thiscall f8n::prefs::Preferences::Load(Preferences *this)

{
  long lVar1;
  bool in_DL;
  function<bool_(int,_nlohmann::json_abi_v3_11_2::detail::parse_event_t,_nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_&)>
  local_f0;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_d0 [2];
  string local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  undefined1 local_30 [8];
  string str;
  Preferences *this_local;
  
  str.field_2._8_8_ = this;
  env::GetDataDirectory_abi_cxx11_(&local_b0,(env *)&DAT_00000001,in_DL);
  std::operator+(&local_90,&local_b0,"/");
  std::operator+(&local_70,&local_90,&this->component);
  std::operator+(&local_50,&local_70,".json");
  fileToString((string *)local_30,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&local_90);
  std::__cxx11::string::~string((string *)&local_b0);
  lVar1 = std::__cxx11::string::size();
  if (lVar1 != 0) {
    std::
    function<bool_(int,_nlohmann::json_abi_v3_11_2::detail::parse_event_t,_nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_&)>
    ::function(&local_f0,(nullptr_t)0x0);
    nlohmann::json_abi_v3_11_2::
    basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
    ::parse<std::__cxx11::string&>
              ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                *)local_d0,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_30,
               &local_f0,true,false);
    nlohmann::json_abi_v3_11_2::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
    ::operator=(&this->json,local_d0);
    nlohmann::json_abi_v3_11_2::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
    ::~basic_json(local_d0);
    std::
    function<bool_(int,_nlohmann::json_abi_v3_11_2::detail::parse_event_t,_nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_&)>
    ::~function(&local_f0);
  }
  std::__cxx11::string::~string((string *)local_30);
  return;
}

Assistant:

void Preferences::Load() {
    std::string str = fileToString(FILENAME(this->component));
    if (str.size()) {
        try {
            this->json = json::parse(str);
        }
        catch (...) {
            std::cerr << "error loading " << this->component << ".json";
            this->json = json::parse("{ }");
        }
    }
}